

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

Vec_Ptr_t * Aig_ManPartitionNaive(Aig_Man_t *p,int nPartSize)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  
  iVar7 = p->nObjs[3] / nPartSize;
  bVar1 = 0 < p->nObjs[3] % nPartSize;
  uVar8 = iVar7 + (uint)bVar1;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  uVar2 = 8;
  if (6 < (iVar7 + (uint)bVar1) - 1) {
    uVar2 = uVar8;
  }
  pVVar4->nCap = uVar2;
  if (uVar2 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)(int)uVar2 << 3);
  }
  pVVar4->pArray = ppvVar5;
  if (0 < (int)uVar8) {
    uVar9 = 0;
    do {
      pvVar6 = calloc(1,0x10);
      ppvVar5[uVar9] = pvVar6;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  pVVar4->nSize = uVar8;
  if (0 < p->vCos->nSize) {
    iVar7 = 0;
    do {
      iVar3 = (int)((long)iVar7 / (long)nPartSize);
      if ((iVar3 < 0) || ((int)uVar8 <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Vec_IntPush((Vec_Int_t *)ppvVar5[(long)iVar7 / (long)nPartSize & 0xffffffff],iVar7);
      iVar7 = iVar7 + 1;
    } while (iVar7 < p->vCos->nSize);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Aig_ManPartitionNaive( Aig_Man_t * p, int nPartSize )
{
    Vec_Ptr_t * vParts;
    Aig_Obj_t * pObj;
    int nParts, i;
    nParts = (Aig_ManCoNum(p) / nPartSize) + ((Aig_ManCoNum(p) % nPartSize) > 0);
    vParts = (Vec_Ptr_t *)Vec_VecStart( nParts );
    Aig_ManForEachCo( p, pObj, i )
        Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(vParts, i / nPartSize), i );
    return vParts;
}